

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O3

int tcp_server(char *host,unsigned_short port)

{
  undefined *puVar1;
  uint uVar2;
  int iVar3;
  hostent *phVar4;
  ulong uVar5;
  ulong unaff_RBX;
  uint uVar6;
  sockaddr *__addr;
  char *pcVar7;
  undefined1 *puVar8;
  int opt;
  undefined4 uStack_84;
  char acStack_80 [24];
  sockaddr sStack_68;
  ulong uStack_58;
  char *pcStack_50;
  sockaddr local_2c;
  undefined4 local_1c;
  
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    tcp_server_cold_3();
LAB_00106e81:
    iVar3 = (int)unaff_RBX;
    tcp_server_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    local_2c.sa_data[10] = '\0';
    local_2c.sa_data[0xb] = '\0';
    local_2c.sa_data[0xc] = '\0';
    local_2c.sa_data[0xd] = '\0';
    local_2c.sa_data[2] = '\0';
    local_2c.sa_data[3] = '\0';
    local_2c.sa_data[4] = '\0';
    local_2c.sa_data[5] = '\0';
    local_2c.sa_data[6] = '\0';
    local_2c.sa_data[7] = '\0';
    local_2c.sa_data[8] = '\0';
    local_2c.sa_data[9] = '\0';
    local_2c.sa_family = 2;
    local_2c.sa_data._0_2_ = port << 8 | port >> 8;
    if (host == (char *)0x0) {
LAB_00106e2d:
      local_1c = 1;
      setsockopt(uVar2,1,2,&local_1c,4);
      iVar3 = bind(uVar2,&local_2c,0x10);
      if (iVar3 != -1) {
        listen(uVar2,0x400);
        return uVar2;
      }
      goto LAB_00106e81;
    }
    iVar3 = inet_pton(2,host,local_2c.sa_data + 2);
    if (iVar3 != 0) goto LAB_00106e2d;
    pcVar7 = host;
    phVar4 = gethostbyname(host);
    iVar3 = (int)pcVar7;
    if (phVar4 != (hostent *)0x0) {
      local_2c.sa_data._2_4_ = *(undefined4 *)*phVar4->h_addr_list;
      goto LAB_00106e2d;
    }
  }
  tcp_server_cold_1();
  puVar8 = (undefined1 *)0x2;
  __addr = (sockaddr *)0x1;
  uStack_58 = unaff_RBX;
  pcStack_50 = host;
  uVar2 = socket(2,1,0);
  if (-1 < (int)uVar2) {
    if (iVar3 != 0) {
      uStack_84 = 1;
      setsockopt(uVar2,1,2,&uStack_84,4);
      acStack_80[0] = '\0';
      acStack_80[1] = '\0';
      acStack_80[2] = '\0';
      acStack_80[3] = '\0';
      acStack_80[4] = '\0';
      acStack_80[5] = '\0';
      acStack_80[6] = '\0';
      acStack_80[7] = '\0';
      acStack_80[8] = '\0';
      acStack_80[9] = '\0';
      acStack_80[10] = '\0';
      acStack_80[0xb] = '\0';
      acStack_80[0xc] = '\0';
      acStack_80[0xd] = '\0';
      acStack_80[0xe] = '\0';
      acStack_80[0xf] = '\0';
      getlocalip(acStack_80);
      __addr = &sStack_68;
      sStack_68.sa_data[6] = '\0';
      sStack_68.sa_data[7] = '\0';
      sStack_68.sa_data[8] = '\0';
      sStack_68.sa_data[9] = '\0';
      sStack_68.sa_data[10] = '\0';
      sStack_68.sa_data[0xb] = '\0';
      sStack_68.sa_data[0xc] = '\0';
      sStack_68.sa_data[0xd] = '\0';
      sStack_68.sa_family = 2;
      sStack_68.sa_data._0_2_ = (short)iVar3;
      sStack_68.sa_data._2_4_ = inet_addr(acStack_80);
      puVar8 = (undefined1 *)(ulong)uVar2;
      iVar3 = bind(uVar2,__addr,0x10);
      if (iVar3 < 0) goto LAB_00106f37;
    }
    return uVar2;
  }
  tcp_client_cold_2();
LAB_00106f37:
  tcp_client_cold_1();
  *puVar8 = 0x3f;
  uVar6 = (uint)__addr;
  uVar2 = (uVar6 & 0xf000) - 0x1000;
  uVar5 = (ulong)uVar2;
  if ((uVar2 < 0xc000) &&
     (uVar5 = (ulong)(uVar2 >> 0xc), (0xaabU >> (uVar2 >> 0xc & 0x1f) & 1) != 0)) {
    puVar1 = &DAT_00108f04 + uVar5;
    uVar5 = (ulong)CONCAT31((uint3)(uVar2 >> 0x14),*puVar1);
    *puVar8 = *puVar1;
  }
  if ((uVar6 >> 8 & 1) != 0) {
    puVar8[1] = 0x72;
  }
  if ((char)__addr < '\0') {
    puVar8[2] = 0x77;
  }
  if (((ulong)__addr & 0x40) != 0) {
    puVar8[3] = 0x78;
  }
  if (((ulong)__addr & 0x20) != 0) {
    puVar8[4] = 0x72;
  }
  if (((ulong)__addr & 0x10) != 0) {
    puVar8[5] = 0x77;
  }
  if (((ulong)__addr & 8) != 0) {
    puVar8[6] = 0x78;
  }
  if (((ulong)__addr & 4) != 0) {
    puVar8[7] = 0x72;
  }
  if (((ulong)__addr & 2) != 0) {
    puVar8[8] = 0x77;
  }
  if (((ulong)__addr & 1) != 0) {
    puVar8[9] = 0x78;
  }
  if ((uVar6 >> 0xb & 1) != 0) {
    uVar5 = CONCAT71((int7)(uVar5 >> 8),(puVar8[3] == 'x') << 5) | 0x53;
    puVar8[3] = (char)uVar5;
  }
  if ((uVar6 >> 10 & 1) != 0) {
    uVar5 = CONCAT71((int7)(uVar5 >> 8),(puVar8[6] == 'x') << 5) | 0x53;
    puVar8[6] = (char)uVar5;
  }
  iVar3 = (int)uVar5;
  if ((uVar6 >> 9 & 1) != 0) {
    uVar5 = CONCAT71((int7)(uVar5 >> 8),(puVar8[9] == 'x') << 5) | 0x53;
    iVar3 = (int)uVar5;
    puVar8[9] = (char)uVar5;
  }
  return iVar3;
}

Assistant:

int tcp_server(const char *host, unsigned short port) {
  int sockfd = -1;
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (sockfd < 0) {
    ERR_EXIT("init socket");
  }

  struct sockaddr_in sa_in;
  bzero(&sa_in, sizeof(sa_in));
  sa_in.sin_family = AF_INET;
  sa_in.sin_port = htons(port);
  if (host != NULL) {
    if (inet_pton(AF_INET, host, &sa_in.sin_addr) == 0) {
      //可能为主机地址
      struct hostent *hp;
      hp = gethostbyname(host);
      if (hp == NULL) {
        ERR_EXIT("get host name");
      }
      sa_in.sin_addr = *((struct in_addr *) hp->h_addr);
    }
  } else {
    sa_in.sin_addr.s_addr = htonl(INADDR_ANY);
  }

  int opt = 1;
  setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));

  if (bind(sockfd, (struct sockaddr *) &sa_in, sizeof(sa_in)) == -1) {
    close(sockfd);
    ERR_EXIT("bind sockfd wit addr");
  }

  listen(sockfd, LISTENQ);

  return sockfd;
}